

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Hospital New_Hospital;
  Hospital local_90;
  
  Hospital::Hospital(&local_90);
  Hospital::menu(&local_90);
  Hospital::~Hospital(&local_90);
  return 0;
}

Assistant:

int main() {

    Hospital New_Hospital;
    New_Hospital.menu();

    return 0;
}